

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LinearConHandler __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnLinearConExpr
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int con_index,
          int num_linear_terms)

{
  LinearExpr *in_RAX;
  pointer this_00;
  MutAlgebraicCon MVar1;
  LinearExprBuilder local_18;
  
  local_18.expr_ = in_RAX;
  MVar1 = BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con(this->builder_,con_index);
  this_00 = ((MVar1.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
            algebraic_cons_).
            super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
            ._M_impl.super__Vector_impl_data._M_start +
            MVar1.
            super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::request_capacity
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)this_00,
             (long)num_linear_terms);
  BasicProblem<mp::BasicProblemParams<int>_>::LinearExprBuilder::LinearExprBuilder
            (&local_18,&this_00->linear_expr);
  return (LinearConHandler)local_18.expr_;
}

Assistant:

LinearConHandler OnLinearConExpr(int con_index, int num_linear_terms) {
    return builder_.algebraic_con(con_index).set_linear_expr(num_linear_terms);
  }